

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O2

void __thiscall
cali::AttributeExtract::AttributeExtract(AttributeExtract *this,SnapshotProcessFn *snap_fn)

{
  AttributeExtractImpl *this_00;
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  local_40;
  
  this_00 = (AttributeExtractImpl *)operator_new(0x28);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::function(&local_40,snap_fn);
  AttributeExtractImpl::AttributeExtractImpl(this_00,&local_40);
  std::__shared_ptr<cali::AttributeExtract::AttributeExtractImpl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cali::AttributeExtract::AttributeExtractImpl,void>
            ((__shared_ptr<cali::AttributeExtract::AttributeExtractImpl,(__gnu_cxx::_Lock_policy)2>
              *)this,this_00);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

AttributeExtract::AttributeExtract(SnapshotProcessFn snap_fn) : mP { new AttributeExtractImpl(snap_fn) }
{}